

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_filter(DUMB_CLICK_REMOVER *cr,IT_FILTER_STATE *state,sample_t_conflict *dst,int32 pos,
              sample_t_conflict *src,int32 size,int step,int sampfreq,int cutoff,int resonance)

{
  undefined8 unaff_RBX;
  undefined8 in_RSI;
  sample_t_conflict *in_RDI;
  sample_t_conflict *unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000020;
  int in_stack_00000030;
  
  it_filter_int((DUMB_CLICK_REMOVER *)CONCAT44(in_stack_00000014,in_stack_00000010),
                (IT_FILTER_STATE *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                (int32)((ulong)unaff_RBX >> 0x20),in_RDI,(int32)((ulong)in_RSI >> 0x20),
                in_stack_00000020,(int)src,in_stack_00000030,(int)dst);
  return;
}

Assistant:

static void it_filter(DUMB_CLICK_REMOVER *cr, IT_FILTER_STATE *state, sample_t *dst, int32 pos, sample_t *src, int32 size, int step, int sampfreq, int cutoff, int resonance)
{
#if defined(_USE_SSE) && (defined(_M_IX86) || defined(__i386__) || defined(_M_X64) || defined(__amd64__))
    _dumb_init_sse();
	if ( _dumb_it_use_sse ) it_filter_sse( cr, state, dst, pos, src, size, step, sampfreq, cutoff, resonance );
	else
#endif
	it_filter_int( cr, state, dst, pos, src, size, step, sampfreq, cutoff, resonance );
}